

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_increasingSequence_Test::~FastPForTest_increasingSequence_Test
          (FastPForTest_increasingSequence_Test *this)

{
  FastPForTest_increasingSequence_Test *in_stack_00000010;
  
  ~FastPForTest_increasingSequence_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(FastPForTest, increasingSequence) {
    in32.resize(0);
    for (int i = -100; i < 156; ++i) {
      in32.push_back(i);
    }
    _verify();
    _copy64();
    _verify64();
  }